

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_function_queue.h
# Opt level: O1

bool __thiscall
density::
lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
::try_reentrant_consume_impl
          (lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
           *this)

{
  uintptr_t uVar1;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *pFVar2;
  void *pvVar3;
  reentrant_consume_operation cons;
  Consume local_38;
  
  local_38.m_queue =
       (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
        *)0x0;
  local_38.m_control = (ControlBlock *)0x0;
  local_38.m_next_ptr = 0;
  detail::
  LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  ::Consume::start_consume_impl
            (&local_38,
             (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
              *)this);
  uVar1 = local_38.m_next_ptr;
  if (0xf < local_38.m_next_ptr) {
    pFVar2 = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
             ::reentrant_consume_operation::complete_type((reentrant_consume_operation *)&local_38);
    pvVar3 = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
             ::reentrant_consume_operation::unaligned_element_ptr
                       ((reentrant_consume_operation *)&local_38);
    (*pFVar2->m_align_invoke_destroy)(pvVar3);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
    ::reentrant_consume_operation::commit_nodestroy((reentrant_consume_operation *)&local_38);
  }
  if (0xf < local_38.m_next_ptr) {
    LOCK();
    (local_38.m_control)->m_next = local_38.m_next_ptr - 2;
    UNLOCK();
  }
  return 0xf < uVar1;
}

Assistant:

bool try_reentrant_consume_impl(std::true_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_reentrant_consume())
            {
                cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return true;
            }
            else
            {
                return false;
            }
        }